

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
inja::Parser::add_operator(Parser *this,Arguments *arguments,OperatorStack *operator_stack)

{
  int i;
  int iVar1;
  _Elt_pointer psVar2;
  value_type function;
  allocator<char> local_59;
  __shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_48;
  
  psVar2 = (operator_stack->c).
           super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar2 == (operator_stack->c).
                super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    psVar2 = (operator_stack->c).
             super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  std::__shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,
             &psVar2[-1].super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>);
  std::
  deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
  ::pop_back(&operator_stack->c);
  if ((int)((ulong)((long)(arguments->
                          super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(arguments->
                         super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 4) <
      (local_58._M_ptr)->number_args) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"too few arguments",&local_59);
    throw_parser_error(this,&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  for (iVar1 = 0; iVar1 < (local_58._M_ptr)->number_args; iVar1 = iVar1 + 1) {
    std::
    vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
    ::insert(&(local_58._M_ptr)->arguments,
             ((local_58._M_ptr)->arguments).
             super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (arguments->
             super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1);
    std::
    vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
    ::pop_back(arguments);
  }
  ::std::
  vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
  ::emplace_back<std::shared_ptr<inja::FunctionNode>&>
            ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
              *)arguments,(shared_ptr<inja::FunctionNode> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return;
}

Assistant:

inline void add_operator(Arguments &arguments, OperatorStack &operator_stack) {
    auto function = operator_stack.top();
    operator_stack.pop();

    if (static_cast<int>(arguments.size()) < function->number_args) {
      throw_parser_error("too few arguments");
    }

    for (int i = 0; i < function->number_args; ++i) {
      function->arguments.insert(function->arguments.begin(), arguments.back());
      arguments.pop_back();
    }
    arguments.emplace_back(function);
  }